

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O2

void __thiscall Fl_Window_Type::draw_overlay(Fl_Window_Type *this)

{
  _func_int *p_Var1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  Fl_Widget_Type *pFVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  Fl_Widget_Type *pFVar17;
  Fl_Widget_Type *myo;
  Fl_Type **ppFVar18;
  uint uVar19;
  Fl_Window_Type *pFVar20;
  Fl_Widget_Type *pFVar21;
  uint uVar22;
  ulong uVar23;
  Fl_Widget *pFVar24;
  double dVar25;
  ulong local_e0;
  uint local_d4;
  int y;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  int t;
  int ysp;
  int ww;
  int hh;
  ulong local_98;
  uint local_8c;
  uint local_88;
  uint local_84;
  int local_80;
  uint local_7c;
  Fl_Widget_Type *local_78;
  Fl_Widget_Type *local_70;
  ulong local_68;
  ulong local_60;
  uint local_58;
  int t_1;
  ulong local_50;
  int ww_1;
  int ih;
  int iw;
  
  if (this->recalc != 0) {
    pFVar24 = (this->super_Fl_Widget_Type).o;
    iVar3 = pFVar24->h_;
    this->bx = pFVar24->w_;
    this->by = iVar3;
    this->br = 0;
    this->bt = 0;
    this->numselected = 0;
    pFVar20 = this;
    while ((pFVar20 = (Fl_Window_Type *)(pFVar20->super_Fl_Widget_Type).super_Fl_Type.next,
           pFVar20 != (Fl_Window_Type *)0x0 &&
           ((this->super_Fl_Widget_Type).super_Fl_Type.level <
            (pFVar20->super_Fl_Widget_Type).super_Fl_Type.level))) {
      if (((pFVar20->super_Fl_Widget_Type).super_Fl_Type.selected != '\0') &&
         ((iVar3 = (*(pFVar20->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x17])(pFVar20),
          iVar3 != 0 &&
          (iVar3 = (*(pFVar20->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x1e])(pFVar20),
          iVar3 == 0)))) {
        this->numselected = this->numselected + 1;
        pFVar24 = (pFVar20->super_Fl_Widget_Type).o;
        iVar3 = pFVar24->x_;
        if (iVar3 < this->bx) {
          this->bx = iVar3;
        }
        iVar5 = pFVar24->y_;
        if (iVar5 < this->by) {
          this->by = iVar5;
        }
        iVar3 = iVar3 + pFVar24->w_;
        if (this->br < iVar3) {
          this->br = iVar3;
        }
        iVar5 = iVar5 + pFVar24->h_;
        if (this->bt < iVar5) {
          this->bt = iVar5;
        }
      }
    }
    this->recalc = 0;
    this->sx = this->bx;
    this->sy = this->by;
    this->sr = this->br;
    this->st = this->bt;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x58);
  iVar3 = this->drag;
  if (iVar3 == 0x20) {
    uVar8 = this->x1;
    uVar22 = this->mx;
    uVar16 = this->my;
    uVar19 = this->y1;
    if (uVar19 == uVar16 && uVar8 == uVar22) {
      iVar3 = 0x20;
    }
    else {
      uVar11 = uVar22;
      if ((int)uVar8 < (int)uVar22) {
        uVar11 = uVar8;
      }
      uVar6 = uVar16;
      if ((int)uVar19 < (int)uVar16) {
        uVar6 = uVar19;
      }
      lVar15 = (long)(int)uVar8 - (long)(int)uVar22;
      lVar7 = -lVar15;
      if (0 < lVar15) {
        lVar7 = lVar15;
      }
      lVar4 = (long)(int)uVar19 - (long)(int)uVar16;
      lVar15 = -lVar4;
      if (0 < lVar4) {
        lVar15 = lVar4;
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[3])
                (fl_graphics_driver,(ulong)uVar11,(ulong)uVar6,lVar7,lVar15);
      iVar3 = this->drag;
    }
  }
  if ((overlays_invisible != 0) && (iVar3 == 0)) {
    return;
  }
  if ((this->super_Fl_Widget_Type).super_Fl_Type.selected != '\0') {
    pFVar24 = (this->super_Fl_Widget_Type).o;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[3])
              (fl_graphics_driver,0,0,(ulong)(uint)pFVar24->w_,(ulong)(uint)pFVar24->h_);
  }
  if (this->numselected == 0) {
    return;
  }
  pFVar24 = (this->super_Fl_Widget_Type).o;
  local_7c = pFVar24->w_;
  uVar8 = pFVar24->h_;
  ppFVar18 = &(this->super_Fl_Widget_Type).super_Fl_Type.next;
  local_60 = 0;
  local_80 = 0;
  pFVar21 = (Fl_Widget_Type *)0x0;
  uVar23 = 0;
  local_d4 = 0;
  local_68 = (ulong)local_7c;
  local_84 = uVar8;
  local_70 = (Fl_Widget_Type *)ppFVar18;
  while( true ) {
    pFVar17 = (Fl_Widget_Type *)*ppFVar18;
    uVar22 = (uint)uVar23;
    if ((pFVar17 == (Fl_Widget_Type *)0x0) ||
       ((pFVar17->super_Fl_Type).level <= (this->super_Fl_Widget_Type).super_Fl_Type.level)) break;
    if ((((pFVar17->super_Fl_Type).selected != '\0') &&
        (iVar3 = (*(pFVar17->super_Fl_Type)._vptr_Fl_Type[0x17])(pFVar17), iVar3 != 0)) &&
       (iVar3 = (*(pFVar17->super_Fl_Type)._vptr_Fl_Type[0x1e])(pFVar17), iVar3 == 0)) {
      local_8c = uVar8;
      local_88 = uVar22;
      newposition(this,pFVar17,&ww_1,&y,&ysp,&t);
      uVar8 = ww_1;
      uVar19 = ysp;
      uVar16 = t;
      uVar22 = y;
      if (((show_guides == 0) || (this->drag == 0)) || (this->numselected != 1)) {
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[3])
                  (fl_graphics_driver,(ulong)(uint)ww_1,(ulong)(uint)y,(ulong)(uint)(ysp - ww_1),
                   (ulong)(uint)(t - y));
      }
      if ((int)uVar8 < (int)local_7c) {
        local_7c = uVar8;
      }
      if ((int)uVar22 < (int)local_84) {
        local_84 = uVar22;
      }
      iVar3 = (int)local_60;
      local_60 = local_60 & 0xffffffff;
      if (iVar3 < (int)uVar19) {
        local_60 = (ulong)uVar19;
      }
      if (local_80 < (int)uVar16) {
        local_80 = uVar16;
      }
      pFVar24 = pFVar17->o;
      uVar11 = (pFVar24->label_).align_;
      if ((uVar11 & 0x10) == 0) {
        ww = 0;
        if ((char)uVar11 < '\0') {
          ww = pFVar24->w_;
        }
        hh = (pFVar24->label_).size;
        Fl_Label::measure(&pFVar24->label_,&ww,&hh);
        uVar11 = (pFVar17->o->label_).align_;
        if ((uVar11 & 1) == 0) {
          if ((uVar11 & 2) == 0) {
            if ((uVar11 & 4) == 0) {
              if ((uVar11 & 8) != 0) {
                uVar19 = uVar19 + ww + 4;
              }
            }
            else {
              uVar8 = (uVar8 - ww) - 4;
            }
          }
          else {
            uVar16 = uVar16 + hh;
            t = uVar16;
          }
        }
        else {
          uVar22 = uVar22 - hh;
          y = uVar22;
        }
      }
      iVar3 = (int)local_68;
      local_68 = local_68 & 0xffffffff;
      if ((int)uVar8 < iVar3) {
        local_68 = (ulong)uVar8;
      }
      uVar8 = local_8c;
      if ((int)uVar22 < (int)local_8c) {
        uVar8 = uVar22;
      }
      if ((int)local_d4 < (int)uVar19) {
        local_d4 = uVar19;
      }
      uVar22 = local_88;
      if ((int)local_88 < (int)uVar16) {
        uVar22 = uVar16;
      }
      uVar23 = (ulong)uVar22;
      pFVar21 = pFVar17;
    }
    ppFVar18 = &(pFVar17->super_Fl_Type).next;
  }
  if ((this->super_Fl_Widget_Type).super_Fl_Type.selected != '\0') {
    return;
  }
  if ((show_guides == 0) || (this->drag == 0)) {
    iVar5 = (int)local_60;
    uVar16 = local_7c;
    iVar3 = local_80;
    uVar19 = local_84;
    local_8c = uVar8;
    local_88 = uVar22;
    goto LAB_0018d5ea;
  }
  local_8c = uVar8;
  local_88 = uVar22;
  (*(this->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x2e])(this,&y,&ysp);
  iVar3 = ysp;
  uVar16 = this->drag;
  uVar19 = local_d4;
  local_78 = pFVar21;
  if (uVar16 == 0) {
    uVar16 = 0;
    local_e0 = local_68;
    local_b8 = uVar23;
  }
  else {
    uVar6 = uVar8 - ysp;
    uVar11 = -uVar6;
    if (0 < (int)uVar6) {
      uVar11 = uVar6;
    }
    if (uVar11 < 3) {
      this->dy = this->dy - uVar6;
      uVar23 = (ulong)(uVar22 - ((int)(uVar16 << 0x1b) >> 0x1f & uVar6));
      draw_v_arrow((int)local_68 + 5,ysp,0);
      uVar16 = this->drag;
      uVar8 = iVar3;
    }
    uVar12 = local_68;
    iVar3 = ((this->super_Fl_Widget_Type).o)->h_;
    uVar11 = iVar3 - (ysp + (int)uVar23);
    uVar22 = -uVar11;
    if (0 < (int)uVar11) {
      uVar22 = uVar11;
    }
    iVar5 = (int)local_68;
    local_b8 = uVar23;
    if (uVar22 < 3) {
      this->dy = this->dy + uVar11;
      uVar8 = ((int)(uVar16 << 0x1b) >> 0x1f & uVar11) + uVar8;
      uVar11 = (int)uVar23 + uVar11;
      local_b8 = (ulong)uVar11;
      draw_v_arrow(iVar5 + 5,uVar11,iVar3);
      uVar16 = this->drag;
    }
    local_e0 = (ulong)(uint)y;
    uVar11 = iVar5 - y;
    uVar22 = -uVar11;
    if (0 < (int)uVar11) {
      uVar22 = uVar11;
    }
    if (uVar22 < 3) {
      this->dx = this->dx - uVar11;
      iVar3 = uVar16 << 0x1b;
      draw_h_arrow(y,uVar8 + 5,0);
      uVar16 = this->drag;
      uVar19 = local_d4 - (iVar3 >> 0x1f & uVar11);
    }
    else {
      local_e0 = uVar12 & 0xffffffff;
    }
    iVar3 = ((this->super_Fl_Widget_Type).o)->w_;
    uVar11 = iVar3 - (y + uVar19);
    uVar22 = -uVar11;
    if (0 < (int)uVar11) {
      uVar22 = uVar11;
    }
    if (uVar22 < 3) {
      this->dx = this->dx + uVar11;
      iVar5 = uVar16 << 0x1b;
      uVar19 = uVar19 + uVar11;
      draw_h_arrow(uVar19,uVar8 + 5,iVar3);
      uVar16 = this->drag;
      local_e0 = (ulong)((iVar5 >> 0x1f & uVar11) + (int)local_e0);
    }
  }
  pFVar21 = local_78;
  uVar23 = (ulong)uVar19;
  if ((this->numselected == 1) && (local_78 != (Fl_Widget_Type *)0x0)) {
    if ((uVar16 & 0x10) == 0) {
      local_c0 = uVar23;
      newposition(this,local_78,&t,&ww,&hh,&t_1);
      iVar5 = hh - t;
      iVar9 = t_1 - ww;
      ih = iVar9;
      iw = iVar5;
      (*(pFVar21->super_Fl_Type)._vptr_Fl_Type[0x2d])(pFVar21);
      iVar3 = t;
      uVar16 = this->drag;
      if ((uVar16 & 0xc) != 0) {
        uVar19 = ih - iVar9;
        uVar22 = -uVar19;
        if (0 < (int)uVar19) {
          uVar22 = uVar19;
        }
        if (uVar22 < 5) {
          if ((uVar16 & 8) == 0) {
            t_1 = t_1 + uVar19;
            local_b8 = (ulong)((int)local_b8 + uVar19);
            iVar9 = uVar19 + this->dy;
          }
          else {
            ww = ww - uVar19;
            uVar8 = uVar8 - uVar19;
            iVar9 = this->dy - uVar19;
          }
          this->dy = iVar9;
        }
        iVar9 = t_1;
        uVar22 = t - 10;
        if (t < 0x32) {
          uVar22 = t + 10;
        }
        uVar12 = (ulong)uVar22;
        local_b0 = (ulong)(uint)ww;
        uVar23 = (ulong)(uint)t_1;
        uVar16 = t_1 - ww;
        sprintf((char *)&ww_1,"%d",(ulong)uVar16);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])(fl_graphics_driver,0,9);
        dVar25 = fl_width((char *)&ww_1);
        uVar19 = iVar9 - 1;
        p_Var1 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9];
        local_98 = uVar23;
        if ((int)uVar16 < 0x1e) {
          local_50 = CONCAT44(local_50._4_4_,uVar22 - 2);
          local_58 = uVar22 + 2;
          uVar11 = (uVar22 - 2) - (int)dVar25;
          if (iVar3 < 0x32) {
            uVar11 = local_58;
          }
          (*p_Var1)(fl_graphics_driver,uVar12,local_b0,(ulong)uVar19);
        }
        else {
          uVar11 = (int)dVar25 / -2 + uVar22;
          iVar3 = (int)local_b0;
          (*p_Var1)(fl_graphics_driver,uVar12,local_b0 & 0xffffffff,
                    (ulong)((uVar16 - 0xb >> 1) + iVar3));
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                    (fl_graphics_driver,uVar12,(ulong)((uVar16 + 0xb >> 1) + iVar3),(ulong)uVar19);
          local_50 = CONCAT44(local_50._4_4_,uVar22 - 2);
          local_58 = uVar22 + 2;
        }
        pFVar21 = local_78;
        uVar23 = local_b0;
        iVar3 = (int)local_b0;
        fl_draw((char *)&ww_1,uVar11,(int)(uVar16 + 9) / 2 + iVar3);
        uVar2 = local_50;
        uVar16 = local_58;
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xd])
                  (fl_graphics_driver,local_50 & 0xffffffff,(ulong)(iVar3 + 5U),uVar12,
                   (ulong)(iVar3 + 1),(ulong)local_58,iVar3 + 5U);
        uVar11 = (int)local_98 - 6;
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xd])
                  (fl_graphics_driver,uVar2 & 0xffffffff,(ulong)uVar11,uVar12,
                   (ulong)((int)local_98 - 2),(ulong)uVar16,uVar11);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                  (fl_graphics_driver,(ulong)(uVar22 - 4),uVar23 & 0xffffffff,(ulong)(uVar22 + 4));
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                  (fl_graphics_driver,(ulong)(uVar22 - 4),(ulong)uVar19,(ulong)(uVar22 + 4));
        uVar16 = this->drag;
      }
      iVar3 = ww;
      uVar23 = local_c0;
      if ((uVar16 & 3) != 0) {
        uVar19 = iw - iVar5;
        uVar22 = -uVar19;
        if (0 < (int)uVar19) {
          uVar22 = uVar19;
        }
        if (uVar22 < 5) {
          if ((uVar16 & 1) == 0) {
            hh = hh + uVar19;
            local_c0 = (ulong)((int)local_c0 + uVar19);
            iVar5 = uVar19 + this->dx;
          }
          else {
            t = t - uVar19;
            local_e0 = (ulong)((int)local_e0 - uVar19);
            iVar5 = this->dx - uVar19;
          }
          this->dx = iVar5;
        }
        uVar22 = ww - 10;
        if (ww < 0x32) {
          uVar22 = ww + 10;
        }
        uVar23 = (ulong)uVar22;
        local_b0 = (ulong)(uint)t;
        local_98 = (ulong)(uint)hh;
        uVar11 = hh - t;
        sprintf((char *)&ww_1,"%d",(ulong)uVar11);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])(fl_graphics_driver,0,9);
        dVar25 = fl_width((char *)&ww_1);
        uVar19 = (uint)dVar25;
        local_50 = (ulong)uVar19;
        uVar16 = uVar22 + 4;
        if ((int)(uVar11 - 0x14) < (int)uVar19) {
          uVar19 = uVar22 - 6;
          if (iVar3 < 0x32) {
            uVar19 = uVar22 + 0xe;
          }
          uVar12 = local_b0 & 0xffffffff;
        }
        else {
          iVar3 = (int)local_b0;
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                    (fl_graphics_driver,local_b0 & 0xffffffff,uVar23,
                     (ulong)(uint)((int)((uVar11 - uVar19) + -2) / 2 + iVar3));
          uVar12 = (ulong)(uint)((int)(uVar19 + uVar11 + 2) / 2 + iVar3);
          uVar19 = uVar16;
        }
        iVar3 = (int)local_98;
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                  (fl_graphics_driver,uVar12,uVar23);
        uVar12 = local_b0;
        iVar5 = (int)local_b0;
        fl_draw((char *)&ww_1,(int)(uVar11 - (int)local_50) / 2 + iVar5,uVar19);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xd])
                  (fl_graphics_driver,(ulong)(iVar5 + 5U),(ulong)(uVar22 - 2),(ulong)(iVar5 + 1),
                   uVar23,(ulong)(iVar5 + 5U),uVar22 + 2);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xd])
                  (fl_graphics_driver,(ulong)(iVar3 - 6U),(ulong)(uVar22 - 2),(ulong)(iVar3 - 2),
                   uVar23,(ulong)(iVar3 - 6U),uVar22 + 2);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                  (fl_graphics_driver,uVar12 & 0xffffffff,(ulong)(uVar22 - 4),(ulong)uVar16);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                  (fl_graphics_driver,(ulong)(iVar3 - 1),(ulong)(uVar22 - 4),(ulong)uVar16);
        uVar16 = this->drag;
        uVar23 = local_c0;
        pFVar21 = local_78;
      }
      goto LAB_0018cc94;
    }
LAB_0018cc9c:
    pFVar17 = local_70;
    iVar3 = (**(code **)&((Fl_Type *)(pFVar21->super_Fl_Type)._vptr_Fl_Type)[1].new_selected)
                      (pFVar21);
    if (iVar3 != 0) {
      while ((pFVar17 = (Fl_Widget_Type *)(pFVar17->super_Fl_Type)._vptr_Fl_Type,
             pFVar17 != (Fl_Widget_Type *)0x0 &&
             ((this->super_Fl_Widget_Type).super_Fl_Type.level < (pFVar17->super_Fl_Type).level))) {
        uVar12 = local_b8;
        if ((pFVar17 != pFVar21) &&
           ((iVar3 = (**(code **)&((Fl_Type *)(pFVar17->super_Fl_Type)._vptr_Fl_Type)[1].
                                  new_selected)(pFVar17), uVar12 = local_b8, iVar3 != 0 &&
            (iVar3 = Fl_Widget::visible_r(pFVar17->o), uVar12 = local_b8, iVar3 != 0)))) {
          pFVar24 = pFVar17->o;
          iVar3 = pFVar24->x_;
          iVar5 = pFVar24->y_;
          iVar9 = pFVar24->w_;
          uVar22 = pFVar24->h_ + iVar5;
          local_c0 = uVar23;
          if (((pFVar24->label_).align_ & 0x10) == 0) {
            t = (pFVar24->label_).size;
            ww_1 = iVar9;
            Fl_Label::measure(&pFVar24->label_,&ww_1,&t);
            pFVar24 = pFVar17->o;
            uVar16 = (pFVar24->label_).align_;
            iVar5 = iVar5 - (-(uVar16 & 1) & t);
            uVar22 = uVar22 + ((int)(uVar16 << 0x1e) >> 0x1f & t);
          }
          uVar12 = (ulong)uVar22;
          iVar9 = iVar9 + iVar3;
          iVar14 = pFVar21->o->y_;
          uVar19 = iVar5 - (pFVar21->o->h_ + iVar14);
          uVar16 = -uVar19;
          if (0 < (int)uVar19) {
            uVar16 = uVar19;
          }
          uVar11 = iVar14 - uVar22;
          uVar19 = -uVar11;
          if (0 < (int)uVar11) {
            uVar19 = uVar11;
          }
          if (uVar16 < uVar19) {
            uVar19 = uVar16;
          }
          uVar16 = this->drag;
          local_b0 = CONCAT44(local_b0._4_4_,uVar22);
          local_98 = CONCAT44(local_98._4_4_,iVar9);
          uVar23 = local_c0;
          if (uVar19 < 0x19) {
            if ((uVar16 & 0x11) != 0) {
              uVar19 = (int)local_e0 - iVar3;
              uVar22 = -uVar19;
              if (0 < (int)uVar19) {
                uVar22 = uVar19;
              }
              if (uVar22 < 3) {
                this->dx = this->dx + uVar19;
                local_e0 = (ulong)((int)local_e0 + uVar19);
                local_c0 = (ulong)((int)local_c0 + ((int)(uVar16 << 0x1b) >> 0x1f & uVar19));
                (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                          (fl_graphics_driver,(ulong)(pFVar24->x_ - 2),(ulong)(uint)pFVar24->y_,
                           (ulong)(pFVar24->x_ + 6));
                (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                          (fl_graphics_driver,(ulong)(pFVar24->x_ - 2),
                           (ulong)((pFVar24->h_ + pFVar24->y_) - 1),(ulong)(pFVar24->x_ + 6));
                (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                          (fl_graphics_driver,(ulong)(uint)pFVar24->x_,(ulong)(pFVar24->y_ - 2),
                           (ulong)(pFVar24->h_ + pFVar24->y_ + 1));
                uVar12 = local_b0 & 0xffffffff;
                uVar16 = this->drag;
                iVar9 = (int)local_98;
              }
            }
            uVar23 = local_c0;
            if ((uVar16 & 0x12) != 0) {
              uVar19 = iVar9 - (int)local_c0;
              uVar22 = -uVar19;
              if (0 < (int)uVar19) {
                uVar22 = uVar19;
              }
              if (uVar22 < 3) {
                this->dx = this->dx + uVar19;
                local_e0 = (ulong)((int)local_e0 + ((int)(uVar16 << 0x1b) >> 0x1f & uVar19));
                pFVar24 = pFVar17->o;
                iVar9 = pFVar24->w_;
                iVar14 = pFVar24->x_;
                uVar22 = iVar9 + -7 + iVar14;
                uVar16 = iVar9 + 1 + iVar14;
                local_70 = pFVar17;
                (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                          (fl_graphics_driver,(ulong)uVar22,(ulong)(uint)pFVar24->y_,(ulong)uVar16);
                (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                          (fl_graphics_driver,(ulong)uVar22,(ulong)((pFVar24->y_ + pFVar24->h_) - 1)
                           ,(ulong)uVar16);
                pFVar17 = local_70;
                pFVar21 = local_78;
                (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                          (fl_graphics_driver,(ulong)(uint)(iVar9 + -1 + iVar14),
                           (ulong)(pFVar24->y_ - 2),(ulong)(pFVar24->h_ + pFVar24->y_ + 1));
                uVar12 = local_b0 & 0xffffffff;
                uVar16 = this->drag;
                uVar23 = local_98 & 0xffffffff;
              }
            }
          }
          if ((uVar16 & 0x18) != 0) {
            uVar19 = uVar8 - iVar5;
            uVar22 = -uVar19;
            if (0 < (int)uVar19) {
              uVar22 = uVar19;
            }
            if (uVar22 < 3) {
              this->dy = this->dy + uVar19;
              uVar8 = uVar8 + uVar19;
              local_b8 = (ulong)((int)local_b8 + ((int)(uVar16 << 0x1b) >> 0x1f & uVar19));
              pFVar24 = pFVar17->o;
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                        (fl_graphics_driver,(ulong)(uint)pFVar24->x_,(ulong)(pFVar24->y_ - 2),
                         (ulong)(pFVar24->y_ + 6));
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                        (fl_graphics_driver,(ulong)((pFVar24->x_ + pFVar24->w_) - 1),
                         (ulong)(pFVar24->y_ - 2),(ulong)(pFVar24->y_ + 6));
              pFVar21 = local_78;
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                        (fl_graphics_driver,(ulong)(pFVar24->x_ - 2),(ulong)(uint)pFVar24->y_,
                         (ulong)(pFVar24->w_ + pFVar24->x_ + 1));
              uVar12 = local_b0 & 0xffffffff;
              uVar16 = this->drag;
            }
          }
          if ((uVar16 & 0x14) != 0) {
            uVar19 = (int)uVar12 - (int)local_b8;
            uVar22 = -uVar19;
            if (0 < (int)uVar19) {
              uVar22 = uVar19;
            }
            if (uVar22 < 3) {
              this->dy = this->dy + uVar19;
              uVar8 = uVar8 + ((int)(uVar16 << 0x1b) >> 0x1f & uVar19);
              pFVar24 = pFVar17->o;
              iVar9 = pFVar24->y_;
              iVar14 = pFVar24->h_;
              local_b8 = CONCAT44(local_b8._4_4_,iVar14 + -1 + iVar9);
              uVar22 = iVar14 + -7 + iVar9;
              uVar16 = iVar14 + 1 + iVar9;
              local_c0 = uVar23;
              local_70 = pFVar17;
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                        (fl_graphics_driver,(ulong)(uint)pFVar24->x_,(ulong)uVar22,(ulong)uVar16);
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                        (fl_graphics_driver,(ulong)((pFVar24->x_ + pFVar24->w_) - 1),(ulong)uVar22,
                         (ulong)uVar16);
              pFVar17 = local_70;
              pFVar21 = local_78;
              uVar23 = local_c0;
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                        (fl_graphics_driver,(ulong)(pFVar24->x_ - 2),local_b8 & 0xffffffff,
                         (ulong)(pFVar24->w_ + pFVar24->x_ + 1));
              local_b8 = uVar12;
            }
          }
          iVar9 = (*(code *)((Fl_Type *)(pFVar21->super_Fl_Type)._vptr_Fl_Type)[2].label_)(pFVar21);
          pFVar13 = pFVar21;
          if (iVar9 == 0) {
            pFVar13 = pFVar17;
          }
          (*(code *)((Fl_Type *)(pFVar13->super_Fl_Type)._vptr_Fl_Type)[3].name_)(pFVar13,&y,&ysp);
          iVar9 = (int)local_b0;
          iVar14 = (int)local_98;
          if (((int)uVar8 <= (int)local_b0) && (iVar5 <= (int)local_b8)) {
            uVar22 = this->drag;
            if ((uVar22 & 0x11) != 0) {
              iVar9 = iVar3 - (int)local_e0;
              uVar19 = iVar9 - y;
              uVar16 = -uVar19;
              if (0 < (int)uVar19) {
                uVar16 = uVar19;
              }
              uVar11 = iVar9 + y;
              if (uVar16 < 3) {
                uVar11 = uVar19;
              }
              uVar16 = -uVar11;
              if (0 < (int)uVar11) {
                uVar16 = uVar11;
              }
              if (uVar16 < 3) {
                this->dx = this->dx + uVar11;
                uVar16 = (int)local_e0 + uVar11;
                local_e0 = (ulong)uVar16;
                uVar23 = (ulong)((int)uVar23 + ((int)(uVar22 << 0x1b) >> 0x1f & uVar11));
                draw_h_arrow(uVar16,(int)((int)local_b8 + uVar8) / 2,iVar3);
                uVar22 = this->drag;
              }
              iVar9 = (int)local_98 - (int)local_e0;
              uVar19 = iVar9 - y;
              uVar16 = -uVar19;
              if (0 < (int)uVar19) {
                uVar16 = uVar19;
              }
              uVar11 = iVar9 + y;
              if (uVar16 < 3) {
                uVar11 = uVar19;
              }
              uVar16 = -uVar11;
              if (0 < (int)uVar11) {
                uVar16 = uVar11;
              }
              iVar14 = (int)local_98;
              if (uVar16 < 3) {
                this->dx = this->dx + uVar11;
                uVar16 = (int)local_e0 + uVar11;
                local_e0 = (ulong)uVar16;
                uVar23 = (ulong)((int)uVar23 + ((int)(uVar22 << 0x1b) >> 0x1f & uVar11));
                draw_h_arrow(uVar16,(int)((int)local_b8 + uVar8) / 2,(int)local_98);
                uVar22 = this->drag;
                iVar14 = (int)local_98;
              }
            }
            iVar9 = (int)local_b0;
            if ((uVar22 & 0x12) != 0) {
              iVar9 = iVar3 - (int)uVar23;
              uVar19 = iVar9 - y;
              uVar16 = -uVar19;
              if (0 < (int)uVar19) {
                uVar16 = uVar19;
              }
              uVar11 = iVar9 + y;
              if (uVar16 < 3) {
                uVar11 = uVar19;
              }
              uVar16 = -uVar11;
              if (0 < (int)uVar11) {
                uVar16 = uVar11;
              }
              if (uVar16 < 3) {
                this->dx = this->dx + uVar11;
                local_e0 = (ulong)((int)local_e0 + ((int)(uVar22 << 0x1b) >> 0x1f & uVar11));
                uVar11 = (int)uVar23 + uVar11;
                uVar23 = (ulong)uVar11;
                draw_h_arrow(uVar11,(int)((int)local_b8 + uVar8) / 2,iVar3);
                iVar14 = (int)local_98;
              }
              iVar9 = iVar14 - (int)uVar23;
              uVar22 = y + iVar9;
              uVar16 = -uVar22;
              if (0 < (int)uVar22) {
                uVar16 = uVar22;
              }
              uVar19 = iVar9 - y;
              if (uVar16 < 3) {
                uVar19 = uVar22;
              }
              uVar22 = -uVar19;
              if (0 < (int)uVar19) {
                uVar22 = uVar19;
              }
              if (uVar22 < 3) {
                this->dx = this->dx + uVar19;
                local_e0 = (ulong)((int)local_e0 + ((this->drag << 0x1b) >> 0x1f & uVar19));
                uVar19 = (int)uVar23 + uVar19;
                uVar23 = (ulong)uVar19;
                draw_h_arrow(uVar19,(int)((int)local_b8 + uVar8) / 2,iVar14);
                iVar14 = (int)local_98;
              }
              iVar9 = (int)local_b0;
            }
          }
          iVar10 = (int)local_e0;
          uVar12 = local_b8;
          if ((iVar10 <= iVar14) && (iVar3 <= (int)uVar23)) {
            uVar22 = this->drag;
            local_c0 = uVar23;
            if ((uVar22 & 0x18) != 0) {
              uVar19 = (iVar5 - uVar8) - ysp;
              uVar16 = -uVar19;
              if (0 < (int)uVar19) {
                uVar16 = uVar19;
              }
              uVar11 = (iVar5 - uVar8) + ysp;
              if (uVar16 < 3) {
                uVar11 = uVar19;
              }
              uVar16 = -uVar11;
              if (0 < (int)uVar11) {
                uVar16 = uVar11;
              }
              if (uVar16 < 3) {
                this->dy = this->dy + uVar11;
                uVar8 = uVar8 + uVar11;
                iVar3 = uVar22 << 0x1b;
                iVar9 = (int)local_b8;
                draw_v_arrow(((int)uVar23 + iVar10) / 2,uVar8,iVar5);
                uVar22 = this->drag;
                uVar12 = (ulong)((iVar3 >> 0x1f & uVar11) + iVar9);
                iVar9 = (int)local_b0;
              }
              uVar19 = (iVar9 - uVar8) - ysp;
              uVar16 = -uVar19;
              if (0 < (int)uVar19) {
                uVar16 = uVar19;
              }
              uVar11 = (iVar9 - uVar8) + ysp;
              if (uVar16 < 3) {
                uVar11 = uVar19;
              }
              uVar16 = -uVar11;
              if (0 < (int)uVar11) {
                uVar16 = uVar11;
              }
              pFVar21 = local_78;
              if (uVar16 < 3) {
                this->dy = this->dy + uVar11;
                uVar8 = uVar8 + uVar11;
                iVar3 = uVar22 << 0x1b;
                draw_v_arrow(((int)local_c0 + iVar10) / 2,uVar8,iVar9);
                uVar22 = this->drag;
                uVar12 = (ulong)((iVar3 >> 0x1f & uVar11) + (int)uVar12);
                pFVar21 = local_78;
                iVar9 = (int)local_b0;
              }
            }
            uVar23 = local_c0;
            if ((uVar22 & 0x14) != 0) {
              iVar3 = iVar5 - (int)uVar12;
              uVar19 = iVar3 - ysp;
              uVar16 = -uVar19;
              if (0 < (int)uVar19) {
                uVar16 = uVar19;
              }
              uVar11 = iVar3 + ysp;
              if (uVar16 < 3) {
                uVar11 = uVar19;
              }
              uVar16 = -uVar11;
              if (0 < (int)uVar11) {
                uVar16 = uVar11;
              }
              if (uVar16 < 3) {
                this->dy = this->dy + uVar11;
                uVar8 = ((int)(uVar22 << 0x1b) >> 0x1f & uVar11) + uVar8;
                uVar11 = (int)uVar12 + uVar11;
                uVar12 = (ulong)uVar11;
                draw_v_arrow(((int)local_c0 + iVar10) / 2,uVar11,iVar5);
                iVar9 = (int)local_b0;
              }
              iVar3 = iVar9 - (int)uVar12;
              uVar16 = iVar3 - ysp;
              uVar22 = -uVar16;
              if (0 < (int)uVar16) {
                uVar22 = uVar16;
              }
              uVar19 = iVar3 + ysp;
              if (uVar22 < 3) {
                uVar19 = uVar16;
              }
              uVar22 = -uVar19;
              if (0 < (int)uVar19) {
                uVar22 = uVar19;
              }
              uVar23 = local_c0;
              if (uVar22 < 3) {
                this->dy = this->dy + uVar19;
                uVar8 = ((this->drag << 0x1b) >> 0x1f & uVar19) + uVar8;
                uVar19 = (int)uVar12 + uVar19;
                local_b8 = (ulong)uVar19;
                draw_v_arrow(((int)local_c0 + iVar10) / 2,uVar19,iVar9);
                uVar23 = local_c0;
                uVar12 = local_b8;
              }
            }
          }
        }
        local_b8 = uVar12;
        pFVar17 = (Fl_Widget_Type *)&(pFVar17->super_Fl_Type).next;
      }
    }
  }
  else {
LAB_0018cc94:
    if (uVar16 != 0) goto LAB_0018cc9c;
  }
  iVar3 = local_7c - (int)local_68;
  iVar5 = ((int)local_60 - local_d4) + (int)uVar23;
  local_68 = local_e0;
  uVar16 = iVar3 + (int)local_e0;
  iVar3 = (local_80 - local_88) + (uint)local_b8;
  uVar19 = (local_84 - local_8c) + uVar8;
  local_8c = uVar8;
  local_88 = (uint)local_b8;
LAB_0018d5ea:
  this->sx = uVar16;
  this->sy = uVar19;
  this->sr = iVar5;
  this->st = iVar3;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[5])(fl_graphics_driver,2,0,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[3])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[5])(fl_graphics_driver,0,0,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[3])
            (fl_graphics_driver,(ulong)uVar16,(ulong)uVar19,(ulong)(iVar5 - uVar16),
             (ulong)(iVar3 - uVar19));
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
            (fl_graphics_driver,(ulong)uVar16,(ulong)uVar19,5,5);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
            (fl_graphics_driver,(ulong)(iVar5 - 5U),(ulong)uVar19,5,5);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
            (fl_graphics_driver,(ulong)(iVar5 - 5U),(ulong)(iVar3 - 5U),5,5);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
            (fl_graphics_driver,(ulong)uVar16,(ulong)(iVar3 - 5U),5,5);
  return;
}

Assistant:

void Fl_Window_Type::draw_overlay() {
  if (recalc) {
    bx = o->w(); by = o->h(); br = 0; bt = 0;
    numselected = 0;
    for (Fl_Type *q=next; q && q->level>level; q=q->next)
      if (q->selected && q->is_widget() && !q->is_menu_item()) {
	numselected++;
	Fl_Widget_Type* myo = (Fl_Widget_Type*)q;
	if (myo->o->x() < bx) bx = myo->o->x();
	if (myo->o->y() < by) by = myo->o->y();
	if (myo->o->x()+myo->o->w() > br) br = myo->o->x()+myo->o->w();
	if (myo->o->y()+myo->o->h() > bt) bt = myo->o->y()+myo->o->h();
      }
    recalc = 0;
    sx = bx; sy = by; sr = br; st = bt;
  }
  fl_color(FL_RED);
  if (drag==BOX && (x1 != mx || y1 != my)) {
    int x = x1; int r = mx; if (x > r) {x = mx; r = x1;}
    int y = y1; int b = my; if (y > b) {y = my; b = y1;}
    fl_rect(x,y,r-x,b-y);
  }
  if (overlays_invisible && !drag) return;
  if (selected) fl_rect(0,0,o->w(),o->h());
  if (!numselected) return;
  int mybx,myby,mybr,mybt;
  int mysx,mysy,mysr,myst;
  mybx = mysx = o->w(); myby = mysy = o->h(); mybr = mysr = 0; mybt = myst = 0;
  Fl_Type *selection = 0L; // used to store the one selected widget (if n==1)
  for (Fl_Type *q=next; q && q->level>level; q = q->next)
    if (q->selected && q->is_widget() && !q->is_menu_item()) {
      selection = q;
      Fl_Widget_Type* myo = (Fl_Widget_Type*)q;
      int x,y,r,t;
      newposition(myo,x,y,r,t);
      if (!show_guides || !drag || numselected != 1) fl_rect(x,y,r-x,t-y);
      if (x < mysx) mysx = x;
      if (y < mysy) mysy = y;
      if (r > mysr) mysr = r;
      if (t > myst) myst = t;
      if (!(myo->o->align() & FL_ALIGN_INSIDE)) {
        // Adjust left/right/top/bottom for top/bottom labels...
	int ww, hh;
	ww = (myo->o->align() & FL_ALIGN_WRAP) ? myo->o->w() : 0;
	hh = myo->o->labelsize();
	myo->o->measure_label(ww, hh);
	if (myo->o->align() & FL_ALIGN_TOP) y -= hh;
	else if (myo->o->align() & FL_ALIGN_BOTTOM) t += hh;
	else if (myo->o->align() & FL_ALIGN_LEFT) x -= ww + 4;
	else if (myo->o->align() & FL_ALIGN_RIGHT) r += ww + 4;
      }
      if (x < mybx) mybx = x;
      if (y < myby) myby = y;
      if (r > mybr) mybr = r;
      if (t > mybt) mybt = t;
    }
  if (selected) return;

  if (show_guides && drag) {
    // draw overlays for UI Guideline distances
    // - check for distance to the window edge
    //    * FLTK suggests 10 pixels from the edge
    int d;
    int xsp, ysp;
    int mybx_bak = mybx, myby_bak = myby, mybr_bak = mybr, mybt_bak = mybt;
    Fl_Widget_Type *mysel = (Fl_Widget_Type *)selection;


    ideal_spacing(xsp, ysp);

    if (drag) {
      // Check top spacing...
      if (abs(d = myby - ysp) < 3) {
	dy -= d;
	if (drag & DRAG) mybt -= d;
	myby -= d;
	draw_v_arrow(mybx+5, myby, 0);
      }

      // Check bottom spacing...
      if (abs(d = o->h() - mybt - ysp) < 3) {
	dy += d;
	if (drag & DRAG) myby += d;
	mybt += d;
	draw_v_arrow(mybx+5, mybt, o->h());
      }

      // Check left spacing...
      if (abs(d = mybx - xsp) < 3) {
        dx -= d;
	if (drag & DRAG) mybr -= d;
	mybx -= d;
	draw_h_arrow(mybx, myby+5, 0);
      }

      // Check right spacing...
      if (abs(d = o->w() - mybr - xsp) < 3) {
	dx += d;
	if (drag & DRAG) mybx += d;
	mybr += d;
	draw_h_arrow(mybr, myby+5, o->w());
      }
    }

    if (numselected==1 && selection && !(drag & DRAG)) {
      // Check ideal sizes
      int x,y,r,t;
      newposition(mysel,x,y,r,t);
      int w = r-x;
      int h = t-y;
      int iw = w, ih = h;

      mysel->ideal_size(iw, ih);

      if (drag & (TOP | BOTTOM)) {
	// Check height
	if (abs(d = ih - h) < 5) {
          // Resize height
	  if (drag & TOP) {
	    myby -= d;
	    y -= d;
	    dy -= d;
	  } else {
	    mybt += d;
	    t += d;
	    dy += d;
	  }
	}

	// Draw height guide
	draw_height(x < 50 ? x+10 : x-10, y, t,
	            x < 50 ? FL_ALIGN_RIGHT : FL_ALIGN_LEFT);
      }

      if (drag & (LEFT | RIGHT)) {
	// Check width
	if (abs(d = iw - w) < 5) {
          // Resize width
          if (drag & LEFT) {
	    mybx -= d;
	    x -= d;
	    dx -= d;
	  } else {
	    mybr += d;
	    r += d;
	    dx += d;
	  }
	}

	// Draw width guide
	draw_width(x, y < 50 ? y+10 : y-10, r,
	           y < 50 ? FL_ALIGN_BOTTOM : FL_ALIGN_TOP);
      }
    }

    // Check spacing and alignment between individual widgets
    if (drag && selection->is_widget()) {
      for (Fl_Type *q=next; q && q->level>level; q = q->next)
	if (q != selection && q->is_widget()) {
          Fl_Widget_Type *qw = (Fl_Widget_Type*)q;
          // Only check visible widgets...
	  if (!qw->o->visible_r()) continue;

          // Get bounding box of widget...
	  int qx = qw->o->x();
	  int qr = qw->o->x() + qw->o->w();
	  int qy = qw->o->y();
	  int qt = qw->o->y() + qw->o->h();

	  if (!(qw->o->align() & FL_ALIGN_INSIDE)) {
            // Adjust top/bottom for top/bottom labels...
	    int ww, hh;
	    ww = qw->o->w();
	    hh = qw->o->labelsize();
	    qw->o->measure_label(ww, hh);
	    if (qw->o->align() & FL_ALIGN_TOP) qy -= hh;
	    if (qw->o->align() & FL_ALIGN_BOTTOM) qt += hh;
	  }

          // Do horizontal alignment when the widget is within 25
	  // pixels vertically...
	  if (fl_min(abs(qy - mysel->o->y() - mysel->o->h()),
	             abs(mysel->o->y() - qt)) < 25) {
            // Align to left of other widget...
            if ((drag & (LEFT | DRAG)) && abs(d = mybx - qx) < 3) {
	      dx += d;
              mybx += d;
	      if (drag & DRAG) mybr += d;

	      draw_left_brace(qw->o);
	    }

            // Align to right of other widget...
            if ((drag & (RIGHT | DRAG)) &&
	        abs(d = qr - mybr) < 3) {
	      dx += d;
              if (drag & DRAG) mybx += d;
	      mybr += d;

	      draw_right_brace(qw->o);
	    }
          }

          // Align to top of other widget...
          if ((drag & (TOP | DRAG)) && abs(d = myby - qy) < 3) {
	    dy += d;
            myby += d;
	    if (drag & DRAG) mybt += d;

	    draw_top_brace(qw->o);
	  }

          // Align to bottom of other widget...
          if ((drag & (BOTTOM | DRAG)) && abs(d = qt - mybt) < 3) {
	    dy += d;
            if (drag & DRAG) myby += d;
	    mybt += d;

	    draw_bottom_brace(qw->o);
	  }

          // Check spacing between widgets
	  if (mysel->is_group()) mysel->ideal_spacing(xsp, ysp);
          else qw->ideal_spacing(xsp, ysp);

          if ((qt)>=myby && qy<=mybt) {
            if (drag & (LEFT | DRAG)) {
	      // Compare left of selected to left of current
	      if (abs(d = qx - mybx - xsp) >= 3)
	        d = qx - mybx + xsp;

	      if (abs(d) < 3) {
		dx += d;
        	mybx += d;
		if (drag & DRAG) mybr += d;

        	// Draw left arrow
		draw_h_arrow(mybx, (myby+mybt)/2, qx);
              }

	      // Compare left of selected to right of current
              if (abs(d = qr - mybx - xsp) >= 3)
	        d = qr - mybx + xsp;

	      if (abs(d) < 3) {
		dx += d;
        	mybx += d;
		if (drag & DRAG) mybr += d;

        	// Draw left arrow
		draw_h_arrow(mybx, (myby+mybt)/2, qr);
              }
	    }

            if (drag & (RIGHT | DRAG)) {
	      // Compare right of selected to left of current
	      if (abs(d = qx - mybr - xsp) >= 3)
	        d = qx - mybr + xsp;

	      if (abs(d) < 3) {
		dx += d;
        	if (drag & DRAG) mybx += d;
		mybr += d;

        	// Draw right arrow
		draw_h_arrow(mybr, (myby+mybt)/2, qx);
              }

	      // Compare right of selected to right of current
              if (abs(d = qr - mybr + xsp) >= 3)
	        d = qr - mybr - xsp;

              if (abs(d) < 3) {
		dx += d;
        	if (drag & DRAG) mybx += d;
		mybr += d;

        	// Draw right arrow
		draw_h_arrow(mybr, (myby+mybt)/2, qr);
              }
            }
	  }

          if (qr>=mybx && qx<=mybr) {
            // Compare top of selected to top of current
            if (drag & (TOP | DRAG)) {
	      if (abs(d = qy - myby - ysp) >= 3)
	        d = qy - myby + ysp;

	      if (abs(d) < 3) {
		dy += d;
		myby += d;
		if (drag & DRAG) mybt += d;

		// Draw up arrow...
		draw_v_arrow((mybx+mybr)/2, myby, qy);
              }

              // Compare top of selected to bottom of current
              if (abs(d = qt - myby - ysp) >= 3)
                d = qt - myby + ysp;

              if (abs(d) < 3) {
		dy += d;
		myby += d;
		if (drag & DRAG) mybt += d;

		// Draw up arrow...
		draw_v_arrow((mybx+mybr)/2, myby, qt);
              }
	    }

	    // Compare bottom of selected to top of current
            if (drag & (BOTTOM | DRAG)) {
	      if (abs(d = qy - mybt - ysp) >= 3)
	        d = qy - mybt + ysp;

	      if (abs(d) < 3) {
		dy += d;
		if (drag & DRAG) myby += d;
		mybt += d;

		// Draw down arrow...
		draw_v_arrow((mybx+mybr)/2, mybt, qy);
              }

	      // Compare bottom of selected to bottom of current
              if (abs(d = qt - mybt - ysp) >= 3)
                d = qt - mybt + ysp;

              if (abs(d) < 3) {
		dy += d;
		if (drag & DRAG) myby += d;
		mybt += d;

		// Draw down arrow...
		draw_v_arrow((mybx+mybr)/2, mybt, qt);
              }
	    }
          }
	}
    }
    mysx += mybx-mybx_bak; mysr += mybr-mybr_bak;
    mysy += myby-myby_bak; myst += mybt-mybt_bak;
  }
  // align the snapping selection box with the box we draw.
  sx = mysx; sy = mysy; sr = mysr; st = myst;

  // Draw selection box + resize handles...
  // draw box including all labels
  fl_line_style(FL_DOT);
  fl_rect(mybx,myby,mybr-mybx,mybt-myby);
  fl_line_style(FL_SOLID);
  // draw box excluding labels
  fl_rect(mysx,mysy,mysr-mysx,myst-mysy);
  fl_rectf(mysx,mysy,5,5);
  fl_rectf(mysr-5,mysy,5,5);
  fl_rectf(mysr-5,myst-5,5,5);
  fl_rectf(mysx,myst-5,5,5);
}